

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

int32_t __thiscall icu_63::Calendar::computeJulianDay(Calendar *this)

{
  int32_t iVar1;
  int iVar2;
  undefined4 extraout_var;
  UCalendarDateFields local_20;
  UCalendarDateFields bestField;
  int32_t bestStamp;
  Calendar *this_local;
  
  if (1 < this->fStamp[0x14]) {
    iVar1 = newestStamp(this,UCAL_ERA,UCAL_DAY_OF_WEEK_IN_MONTH,0);
    iVar1 = newestStamp(this,UCAL_YEAR_WOY,UCAL_EXTENDED_YEAR,iVar1);
    if (iVar1 <= this->fStamp[0x14]) {
      iVar1 = internalGet(this,UCAL_JULIAN_DAY);
      return iVar1;
    }
  }
  iVar2 = (*(this->super_UObject)._vptr_UObject[0x28])();
  local_20 = resolveFields(this,(UFieldResolutionTable *)CONCAT44(extraout_var,iVar2));
  if (local_20 == UCAL_FIELD_COUNT) {
    local_20 = UCAL_DATE;
  }
  iVar2 = (*(this->super_UObject)._vptr_UObject[0x25])(this,(ulong)local_20);
  return iVar2;
}

Assistant:

int32_t Calendar::computeJulianDay()
{
    // We want to see if any of the date fields is newer than the
    // JULIAN_DAY.  If not, then we use JULIAN_DAY.  If so, then we do
    // the normal resolution.  We only use JULIAN_DAY if it has been
    // set by the user.  This makes it possible for the caller to set
    // the calendar to a time and call clear(MONTH) to reset the MONTH
    // to January.  This is legacy behavior.  Without this,
    // clear(MONTH) has no effect, since the internally set JULIAN_DAY
    // is used.
    if (fStamp[UCAL_JULIAN_DAY] >= (int32_t)kMinimumUserStamp) {
        int32_t bestStamp = newestStamp(UCAL_ERA, UCAL_DAY_OF_WEEK_IN_MONTH, kUnset);
        bestStamp = newestStamp(UCAL_YEAR_WOY, UCAL_EXTENDED_YEAR, bestStamp);
        if (bestStamp <= fStamp[UCAL_JULIAN_DAY]) {
            return internalGet(UCAL_JULIAN_DAY);
        }
    }

    UCalendarDateFields bestField = resolveFields(getFieldResolutionTable());
    if (bestField == UCAL_FIELD_COUNT) {
        bestField = UCAL_DAY_OF_MONTH;
    }

    return handleComputeJulianDay(bestField);
}